

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O3

void __thiscall QGraphicsBlurEffect::setBlurHints(QGraphicsBlurEffect *this,BlurHints hints)

{
  long lVar1;
  QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> QVar2;
  long in_FS_OFFSET;
  QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> local_3c;
  void *local_38;
  QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  QVar2.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i =
       (QFlagsStorage<QGraphicsBlurEffect::BlurHint>)
       QPixmapBlurFilter::blurHints(*(QPixmapBlurFilter **)(lVar1 + 0xa8));
  if (QVar2.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i !=
      (QFlagsStorage<QGraphicsBlurEffect::BlurHint>)
      hints.super_QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4>.
      super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i) {
    QPixmapBlurFilter::setBlurHints(*(QPixmapBlurFilter **)(lVar1 + 0xa8),hints);
    local_30 = &local_3c;
    local_38 = (void *)0x0;
    local_3c.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i =
         (QFlagsStorage<QGraphicsBlurEffect::BlurHint>)
         (QFlagsStorage<QGraphicsBlurEffect::BlurHint>)
         hints.super_QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4>.
         super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsBlurEffect::setBlurHints(QGraphicsBlurEffect::BlurHints hints)
{
    Q_D(QGraphicsBlurEffect);
    if (d->filter->blurHints() == hints)
        return;

    d->filter->setBlurHints(hints);
    emit blurHintsChanged(hints);
}